

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O1

string * __thiscall
MultiAgentDecisionProcessDiscrete::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MultiAgentDecisionProcessDiscrete *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  MultiAgentDecisionProcess::SoftPrint_abi_cxx11_(&local_1c8,&this->super_MultiAgentDecisionProcess)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  paVar1 = &local_1c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  MADPComponentDiscreteStates::SoftPrint_abi_cxx11_(&local_1c8,&this->_m_S);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  MADPComponentDiscreteActions::SoftPrint_abi_cxx11_(&local_1c8,&this->_m_A);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  MADPComponentDiscreteObservations::SoftPrint_abi_cxx11_(&local_1c8,&this->_m_O);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (this->_m_initialized == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Transition model: ",0x12);
    cVar2 = (char)(ostream *)local_198;
    std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    (*(this->_m_p_tModel->super_TransitionModelDiscreteInterface).super_TransitionModel.
      _vptr_TransitionModel[3])(&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Observation model: ",0x13);
    std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    (*(this->_m_p_oModel->super_ObservationModelDiscreteInterface).super_ObservationModel.
      _vptr_ObservationModel[3])(&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string MultiAgentDecisionProcessDiscrete::SoftPrint() const
{
    stringstream ss;

    ss << MultiAgentDecisionProcess::SoftPrint();
    ss << _m_S.SoftPrint();
    ss << _m_A.SoftPrint();
    ss << _m_O.SoftPrint();   
   
    if(_m_initialized)
    {
        ss << "Transition model: " << endl;
        ss << _m_p_tModel->SoftPrint();
        ss << "Observation model: " << endl;
        ss << _m_p_oModel->SoftPrint();
    }
    return(ss.str());
}